

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_http_client.hpp
# Opt level: O0

bool __thiscall cinatra::coro_http_client::init_config(coro_http_client *this,config *conf)

{
  bool bVar1;
  duration<long,_std::ratio<1L,_1000000000L>_> *pdVar2;
  long in_RSI;
  coro_http_client *in_RDI;
  config *in_stack_ffffffffffffff98;
  coro_http_client *in_stack_ffffffffffffffa0;
  coro_http_client *in_stack_ffffffffffffffb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd8;
  duration in_stack_ffffffffffffffe0;
  
  config::operator=((config *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  bVar1 = std::optional<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>::has_value
                    ((optional<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_> *)
                     0x454d83);
  if (bVar1) {
    pdVar2 = std::optional<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>::operator*
                       ((optional<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_> *)
                        0x454d93);
    set_conn_timeout(in_RDI,(duration)pdVar2->__r);
  }
  bVar1 = std::optional<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>::has_value
                    ((optional<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_> *)
                     0x454db8);
  if (bVar1) {
    pdVar2 = std::optional<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>::operator*
                       ((optional<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_> *)
                        0x454dcc);
    in_stack_ffffffffffffffe0.__r = pdVar2->__r;
    set_req_timeout(in_RDI,in_stack_ffffffffffffffe0);
  }
  bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x454df1);
  if (!bVar1) {
    in_stack_ffffffffffffffa0 = (coro_http_client *)&stack0xffffffffffffffc0;
    std::__cxx11::string::string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffffe0.__r,in_stack_ffffffffffffffd8);
    set_ws_sec_key(in_stack_ffffffffffffffa0,(string *)in_stack_ffffffffffffff98);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffffa0);
  }
  if (*(long *)(in_RSI + 0x40) != 0) {
    set_max_single_part_size(in_RDI,*(size_t *)(in_RSI + 0x40));
  }
  bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x454e74);
  if (!bVar1) {
    set_proxy_basic_auth
              (in_stack_ffffffffffffffb0,(string *)in_RDI,(string *)in_stack_ffffffffffffffa0);
  }
  bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x454ea5);
  if (!bVar1) {
    set_proxy_basic_auth
              (in_stack_ffffffffffffffb0,(string *)in_RDI,(string *)in_stack_ffffffffffffffa0);
  }
  bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x454edc);
  if (!bVar1) {
    set_proxy_bearer_token_auth(in_stack_ffffffffffffffa0,(string *)in_stack_ffffffffffffff98);
  }
  if ((*(byte *)(in_RSI + 0xe8) & 1) != 0) {
    in_RDI->enable_tcp_no_delay_ = (bool)(*(byte *)(in_RSI + 0xe8) & 1);
  }
  return true;
}

Assistant:

bool init_config(const config &conf) {
    config_ = conf;
    if (conf.conn_timeout_duration.has_value()) {
      set_conn_timeout(*conf.conn_timeout_duration);
    }
    if (conf.req_timeout_duration.has_value()) {
      set_req_timeout(*conf.req_timeout_duration);
    }
    if (!conf.sec_key.empty()) {
      set_ws_sec_key(conf.sec_key);
    }
    if (conf.max_single_part_size > 0) {
      set_max_single_part_size(conf.max_single_part_size);
    }
    if (!conf.proxy_host.empty()) {
      set_proxy_basic_auth(conf.proxy_host, conf.proxy_port);
    }
    if (!conf.proxy_auth_username.empty()) {
      set_proxy_basic_auth(conf.proxy_auth_username, conf.proxy_auth_passwd);
    }
    if (!conf.proxy_auth_token.empty()) {
      set_proxy_bearer_token_auth(conf.proxy_auth_token);
    }
    if (conf.enable_tcp_no_delay) {
      enable_tcp_no_delay_ = conf.enable_tcp_no_delay;
    }
#ifdef CINATRA_ENABLE_SSL
    set_ssl_schema(conf.use_ssl);
#endif
    return true;
  }